

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.c
# Opt level: O0

mi_page_t *
mi_page_fresh_alloc(mi_heap_t *heap,mi_page_queue_t *pq,size_t block_size,size_t page_alignment)

{
  _Bool _Var1;
  mi_page_t *in_RCX;
  mi_tld_t *in_RDX;
  long in_RSI;
  size_t full_block_size;
  mi_page_t *page;
  mi_segments_tld_t *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  mi_tld_t *queue;
  mi_heap_t *in_stack_ffffffffffffffd0;
  mi_tld_t *heap_00;
  undefined8 local_8;
  
  local_8 = (mi_heap_t *)
            _mi_segment_page_alloc
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
                       ,in_stack_ffffffffffffffb8);
  if (local_8 == (mi_heap_t *)0x0) {
    local_8 = (mi_heap_t *)0x0;
  }
  else {
    heap_00 = in_RDX;
    if ((in_RSI == 0) || (_Var1 = mi_page_is_huge((mi_page_t *)local_8), heap_00 = in_RDX, _Var1)) {
      in_RDX = (mi_tld_t *)mi_page_block_size((mi_page_t *)local_8);
    }
    queue = in_RDX;
    mi_page_init((mi_heap_t *)heap_00,in_RCX,(size_t)local_8,in_RDX);
    if (in_RSI != 0) {
      mi_page_queue_push(local_8,(mi_page_queue_t *)queue,(mi_page_t *)in_RDX);
    }
  }
  return (mi_page_t *)local_8;
}

Assistant:

static mi_page_t* mi_page_fresh_alloc(mi_heap_t* heap, mi_page_queue_t* pq, size_t block_size, size_t page_alignment) {
  #if !MI_HUGE_PAGE_ABANDON
  mi_assert_internal(pq != NULL);
  mi_assert_internal(mi_heap_contains_queue(heap, pq));
  mi_assert_internal(page_alignment > 0 || block_size > MI_MEDIUM_OBJ_SIZE_MAX || block_size == pq->block_size);
  #endif
  mi_page_t* page = _mi_segment_page_alloc(heap, block_size, page_alignment, &heap->tld->segments);
  if (page == NULL) {
    // this may be out-of-memory, or an abandoned page was reclaimed (and in our queue)
    return NULL;
  }
  #if MI_HUGE_PAGE_ABANDON
  mi_assert_internal(pq==NULL || _mi_page_segment(page)->page_kind != MI_PAGE_HUGE);
  #endif
  mi_assert_internal(page_alignment >0 || block_size > MI_MEDIUM_OBJ_SIZE_MAX || _mi_page_segment(page)->kind != MI_SEGMENT_HUGE);
  mi_assert_internal(pq!=NULL || mi_page_block_size(page) >= block_size);
  // a fresh page was found, initialize it
  const size_t full_block_size = (pq == NULL || mi_page_is_huge(page) ? mi_page_block_size(page) : block_size); // see also: mi_segment_huge_page_alloc
  mi_assert_internal(full_block_size >= block_size);
  mi_page_init(heap, page, full_block_size, heap->tld);
  mi_heap_stat_increase(heap, pages, 1);
  mi_heap_stat_increase(heap, page_bins[mi_page_bin(page)], 1);
  if (pq != NULL) { mi_page_queue_push(heap, pq, page); }
  mi_assert_expensive(_mi_page_is_valid(page));
  return page;
}